

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall tokenizer::read_number(tokenizer *this)

{
  int iVar1;
  tokenizer *this_local;
  
  this->last_line_number = this->line_number;
  this->last_position_number = this->position_number;
  while ((*this->line_char != '\0' && (iVar1 = isdigit((int)*this->line_char), iVar1 != 0))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&this->current_word,*this->line_char);
    advance_to_next_character(this);
  }
  add_token_to_stream(this,integer);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->current_word,"");
  return;
}

Assistant:

void tokenizer::read_number() {
    last_line_number = line_number;
    last_position_number = position_number;

    while(*line_char != '\0') {
        if(isdigit(*line_char)) {
            current_word += *line_char;
            this->advance_to_next_character();
        }
        else {
            break;
        }
    }

    this->add_token_to_stream(Token_Type::integer);

    //position_number += current_word.length();
    current_word = "";
}